

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_sasl_challenge(SASL_CHALLENGE_HANDLE sasl_challenge)

{
  SASL_CHALLENGE_INSTANCE *sasl_challenge_instance;
  AMQP_VALUE result;
  SASL_CHALLENGE_HANDLE sasl_challenge_local;
  
  if (sasl_challenge == (SASL_CHALLENGE_HANDLE)0x0) {
    sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE *)0x0;
  }
  else {
    sasl_challenge_instance =
         (SASL_CHALLENGE_INSTANCE *)amqpvalue_clone(sasl_challenge->composite_value);
  }
  return (AMQP_VALUE)sasl_challenge_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_challenge(SASL_CHALLENGE_HANDLE sasl_challenge)
{
    AMQP_VALUE result;

    if (sasl_challenge == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_CHALLENGE_INSTANCE* sasl_challenge_instance = (SASL_CHALLENGE_INSTANCE*)sasl_challenge;
        result = amqpvalue_clone(sasl_challenge_instance->composite_value);
    }

    return result;
}